

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_DecCreateCnf(Vec_Int_t *vGateSizes,Vec_Wrd_t *vGateFuncs,Vec_Wec_t *vGateCnfs)

{
  int iVar1;
  Vec_Str_t *vCnf_00;
  Vec_Int_t *vCover_00;
  word Truth;
  Vec_Int_t *p;
  char *__dest;
  char *__src;
  int local_44;
  int nCubes;
  int i;
  word uTruth;
  Vec_Int_t *vCover;
  Vec_Str_t *vCnfBase;
  Vec_Str_t *vCnf;
  Vec_Wec_t *vGateCnfs_local;
  Vec_Wrd_t *vGateFuncs_local;
  Vec_Int_t *vGateSizes_local;
  
  vCnf_00 = Vec_StrAlloc(100);
  vCover_00 = Vec_IntAlloc(100);
  for (local_44 = 0; iVar1 = Vec_WrdSize(vGateFuncs), local_44 < iVar1; local_44 = local_44 + 1) {
    Truth = Vec_WrdEntry(vGateFuncs,local_44);
    iVar1 = Vec_IntEntry(vGateSizes,local_44);
    Sfm_TruthToCnf(Truth,iVar1,vCover_00,vCnf_00);
    p = Vec_WecEntry(vGateCnfs,local_44);
    iVar1 = Vec_StrSize(vCnf_00);
    Vec_StrGrow((Vec_Str_t *)p,iVar1);
    __dest = Vec_StrArray((Vec_Str_t *)p);
    __src = Vec_StrArray(vCnf_00);
    iVar1 = Vec_StrSize(vCnf_00);
    memcpy(__dest,__src,(long)iVar1);
    iVar1 = Vec_StrSize(vCnf_00);
    p->nSize = iVar1;
  }
  Vec_IntFree(vCover_00);
  Vec_StrFree(vCnf_00);
  return;
}

Assistant:

void Sfm_DecCreateCnf( Vec_Int_t * vGateSizes, Vec_Wrd_t * vGateFuncs, Vec_Wec_t * vGateCnfs )
{
    Vec_Str_t * vCnf, * vCnfBase;
    Vec_Int_t * vCover;
    word uTruth;
    int i, nCubes;
    vCnf = Vec_StrAlloc( 100 );
    vCover = Vec_IntAlloc( 100 );
    Vec_WrdForEachEntry( vGateFuncs, uTruth, i )
    {
        nCubes = Sfm_TruthToCnf( uTruth, Vec_IntEntry(vGateSizes, i), vCover, vCnf );
        vCnfBase = (Vec_Str_t *)Vec_WecEntry( vGateCnfs, i );
        Vec_StrGrow( vCnfBase, Vec_StrSize(vCnf) );
        memcpy( Vec_StrArray(vCnfBase), Vec_StrArray(vCnf), Vec_StrSize(vCnf) );
        vCnfBase->nSize = Vec_StrSize(vCnf);
    }
    Vec_IntFree( vCover );
    Vec_StrFree( vCnf );
}